

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_base_boundary_z5_methods<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
               (void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_03;
  undefined8 uVar1;
  bool bVar2;
  uint columnIndex;
  size_type sVar3;
  lazy_ostream *plVar4;
  undefined4 local_5f4;
  size_t local_5f0;
  basic_cstring<const_char> local_5e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5d8;
  basic_cstring<const_char> local_5b0;
  basic_cstring<const_char> local_5a0;
  basic_cstring<const_char> local_590;
  basic_cstring<const_char> local_580;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_570;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_550;
  assertion_result local_538;
  basic_cstring<const_char> local_520;
  basic_cstring<const_char> local_510;
  initializer_list<unsigned_int> local_500;
  undefined4 local_4ec;
  size_t local_4e8;
  basic_cstring<const_char> local_4e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_4d0;
  basic_cstring<const_char> local_4a8;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_468;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_448;
  assertion_result local_430;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  uint local_3f8 [10];
  iterator local_3d0;
  undefined8 local_3c8;
  undefined4 local_3bc;
  size_t local_3b8;
  basic_cstring<const_char> local_3b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3a0;
  basic_cstring<const_char> local_378;
  basic_cstring<const_char> local_368;
  basic_cstring<const_char> local_358;
  basic_cstring<const_char> local_348;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_338;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_318;
  assertion_result local_300;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  uint local_2c8 [10];
  iterator local_2a0;
  undefined8 local_298;
  allocator<unsigned_int> local_289;
  uint local_288 [8];
  iterator local_268;
  size_type local_260;
  undefined1 local_258 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  size_t local_238;
  basic_cstring<const_char> local_230;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_220;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  assertion_result local_180;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158;
  uint local_148 [10];
  iterator local_120;
  undefined8 local_118;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_109;
  int local_108 [10];
  pair<unsigned_int,_unsigned_int> local_e0;
  pair<unsigned_int,_unsigned_int> local_d8;
  pair<unsigned_int,_unsigned_int> local_d0;
  pair<unsigned_int,_unsigned_int> local_c8;
  pair<unsigned_int,_unsigned_int> local_c0;
  iterator local_b8;
  size_type local_b0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_a8;
  undefined1 local_90 [8];
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  col;
  undefined1 local_48 [8];
  Column_settings settings;
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
  Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings((Column_zp_settings *)local_48,5);
  local_108[9] = 0;
  local_108[8] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_e0,local_108 + 9,local_108 + 8)
  ;
  local_108[7] = 1;
  local_108[6] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_d8,local_108 + 7,local_108 + 6)
  ;
  local_108[5] = 2;
  local_108[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_d0,local_108 + 5,local_108 + 4)
  ;
  local_108[3] = 5;
  local_108[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_c8,local_108 + 3,local_108 + 2)
  ;
  local_108[1] = 6;
  local_108[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_c0,local_108 + 1,local_108);
  local_b8 = &local_e0;
  local_b0 = 5;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_109);
  __l_03._M_len = local_b0;
  __l_03._M_array = local_b8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_a8,__l_03,&local_109);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
  ::
  Intrusive_list_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
              *)local_90,&local_a8,(Column_settings *)local_48);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_a8);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_109);
  local_148[4] = 0;
  local_148[5] = 1;
  local_148[6] = 1;
  local_148[0] = 4;
  local_148[1] = 2;
  local_148[2] = 1;
  local_148[3] = 0;
  local_120 = local_148;
  local_118 = 7;
  __l_02._M_len = 7;
  __l_02._M_array = local_120;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l_02);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_168);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_158,0x274,&local_168);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
    ::get_content(&local_198,
                  (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                   *)local_90,(int)sVar3);
    bVar2 = std::operator==(&local_198,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_180,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_1b8,plVar4,&local_1c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_180,&local_1b8,&local_1d8,0x274,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1b8);
    boost::test_tools::assertion_result::~assertion_result(&local_180);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_198);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e8,0x275,&local_1f8);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_220,plVar4,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_238 = Gudhi::persistence_matrix::
                Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                ::size((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                        *)local_90);
    permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_220,&local_230,0x275,1,2,&local_238,"col.size()",
               (undefined1 *)
               ((long)&permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4),"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_220);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_288[4] = 1;
  local_288[5] = 4;
  local_288[6] = 6;
  local_288[0] = 0;
  local_288[1] = 5;
  local_288[2] = 2;
  local_288[3] = 3;
  local_268 = local_288;
  local_260 = 7;
  std::allocator<unsigned_int>::allocator(&local_289);
  __l_01._M_len = local_260;
  __l_01._M_array = local_268;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258,__l_01,&local_289);
  std::allocator<unsigned_int>::~allocator(&local_289);
  columnIndex = Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
                ::get_null_value<unsigned_int>();
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
  ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
              *)local_90,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258,
             columnIndex);
  local_2c8[4] = 1;
  local_2c8[5] = 2;
  local_2c8[6] = 1;
  local_2c8[0] = 4;
  local_2c8[1] = 0;
  local_2c8[2] = 1;
  local_2c8[3] = 0;
  local_2a0 = local_2c8;
  local_298 = 7;
  __l_00._M_len = 7;
  __l_00._M_array = local_2a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l_00);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2d8,0x27a,&local_2e8);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
    ::get_content(&local_318,
                  (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                   *)local_90,(int)sVar3);
    bVar2 = std::operator==(&local_318,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_300,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_348,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_338,plVar4,&local_348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_300,&local_338,&local_358,0x27a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_338);
    boost::test_tools::assertion_result::~assertion_result(&local_300);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_318);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_378);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_368,0x27b,&local_378);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3a0,plVar4,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_3b8 = Gudhi::persistence_matrix::
                Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                ::size((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                        *)local_90);
    local_3bc = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_3a0,&local_3b0,0x27b,1,2,&local_3b8,"col.size()",&local_3bc,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  ::clear((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
           *)local_90,2);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  ::clear((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
           *)local_90,6);
  local_3f8[4] = 1;
  local_3f8[5] = 2;
  local_3f8[6] = 0;
  local_3f8[0] = 4;
  local_3f8[1] = 0;
  local_3f8[2] = 0;
  local_3f8[3] = 0;
  local_3d0 = local_3f8;
  local_3c8 = 7;
  __l._M_len = 7;
  __l._M_array = local_3d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_418);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_408,0x280,&local_418);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
    ::get_content(&local_448,
                  (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                   *)local_90,(int)sVar3);
    bVar2 = std::operator==(&local_448,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_430,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_468,plVar4,&local_478);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_430,&local_468,&local_488,0x280,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_468);
    boost::test_tools::assertion_result::~assertion_result(&local_430);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_448);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_498,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_498,0x281,&local_4a8);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4d0,plVar4,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_4e8 = Gudhi::persistence_matrix::
                Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                ::size((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                        *)local_90);
    local_4ec = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_4d0,&local_4e0,0x281,1,2,&local_4e8,"col.size()",&local_4ec,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_4d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  ::clear((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
           *)local_90);
  std::initializer_list<unsigned_int>::initializer_list(&local_500);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,local_500);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_520);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_510,0x285,&local_520);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
    ::get_content(&local_550,
                  (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                   *)local_90,(int)sVar3);
    bVar2 = std::operator==(&local_550,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_538,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_580,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_570,plVar4,&local_580);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_590,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_538,&local_570,&local_590,0x285,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_570);
    boost::test_tools::assertion_result::~assertion_result(&local_538);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_550);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5a0,0x286,&local_5b0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5d8,plVar4,(char (*) [1])0x2cd16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_5f0 = Gudhi::persistence_matrix::
                Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                ::size((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                        *)local_90);
    local_5f4 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_5d8,&local_5e8,0x286,1,2,&local_5f0,"col.size()",&local_5f4,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  ::~Intrusive_list_column
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
              *)local_90);
  Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
  ::Column_zp_settings::~Column_zp_settings((Column_zp_settings *)local_48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
  return;
}

Assistant:

void column_test_base_boundary_z5_methods() {
  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings(5);

  Column col(
      std::vector<std::pair<unsigned int, typename Column::Field_element> >{
          {0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}},
      &settings);
  veccont = {4, 2, 1, 0, 0, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  std::vector<unsigned int> permutation{0, 5, 2, 3, 1, 4, 6};
  col.reorder(permutation);
  veccont = {4, 0, 1, 0, 1, 2, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  col.clear(2);
  col.clear(6);
  veccont = {4, 0, 0, 0, 1, 2, 0};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 3);

  col.clear();
  veccont = {};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 0);
}